

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_add_child_head(isoent *parent,isoent *child)

{
  isoent *piVar1;
  int iVar2;
  isoent *child_local;
  isoent *parent_local;
  
  iVar2 = __archive_rb_tree_insert_node(&parent->rbtree,&child->rbnode);
  if (iVar2 == 0) {
    parent_local._4_4_ = 0;
  }
  else {
    piVar1 = (parent->children).first;
    child->chnext = piVar1;
    if (piVar1 == (isoent *)0x0) {
      (parent->children).last = &child->chnext;
    }
    (parent->children).first = child;
    (parent->children).cnt = (parent->children).cnt + 1;
    child->parent = parent;
    if ((char)(child->field_0xe8 << 6) < '\0') {
      piVar1 = (parent->subdirs).first;
      child->drnext = piVar1;
      if (piVar1 == (isoent *)0x0) {
        (parent->subdirs).last = &child->drnext;
      }
      (parent->subdirs).first = child;
      (parent->subdirs).cnt = (parent->subdirs).cnt + 1;
      child->parent = parent;
    }
    else {
      child->drnext = (isoent *)0x0;
    }
    parent_local._4_4_ = 1;
  }
  return parent_local._4_4_;
}

Assistant:

static int
isoent_add_child_head(struct isoent *parent, struct isoent *child)
{

	if (!__archive_rb_tree_insert_node(
	    &(parent->rbtree), (struct archive_rb_node *)child))
		return (0);
	if ((child->chnext = parent->children.first) == NULL)
		parent->children.last = &(child->chnext);
	parent->children.first = child;
	parent->children.cnt++;
	child->parent = parent;

	/* Add a child to a sub-directory chain */
	if (child->dir) {
		if ((child->drnext = parent->subdirs.first) == NULL)
			parent->subdirs.last = &(child->drnext);
		parent->subdirs.first = child;
		parent->subdirs.cnt++;
		child->parent = parent;
	} else
		child->drnext = NULL;
	return (1);
}